

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManDfsCollect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vObjs)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  
  while( true ) {
    iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
    if (iVar1 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrent(p,pObj);
    uVar4 = (uint)*(ulong *)pObj;
    if ((~uVar4 & 0x9fffffff) == 0) break;
    uVar7 = uVar4 & 0x1fffffff;
    if ((-1 < (int)uVar4) || (uVar7 == 0x1fffffff)) {
      if ((int)uVar4 < 0 || uVar7 == 0x1fffffff) {
        if ((~*(ulong *)pObj & 0x1fffffff1fffffff) == 0) {
          return;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                      ,0x3b0,"void Gia_ManDfsCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      uVar4 = Gia_ObjId(p,pObj);
      if (p->vMapping == (Vec_Int_t *)0x0) {
        Gia_ManDfsCollect_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),vObjs);
        Gia_ManDfsCollect_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),vObjs);
      }
      else {
        iVar1 = Gia_ObjIsLut(p,uVar4);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsLut(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                        ,0x3a3,"void Gia_ManDfsCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        for (lVar8 = 0; iVar1 = Gia_ObjLutSize(p,uVar4), lVar8 < iVar1; lVar8 = lVar8 + 1) {
          piVar5 = Gia_ObjLutFanins(p,uVar4);
          pGVar6 = Gia_ManObj(p,piVar5[lVar8]);
          Gia_ManDfsCollect_rec(p,pGVar6,vObjs);
        }
      }
      goto LAB_001f9d7e;
    }
    pObj = pObj + -(ulong)uVar7;
  }
  p_00 = (Tim_Man_t *)p->pManTime;
  if (p_00 == (Tim_Man_t *)0x0) {
    return;
  }
  iVar1 = Gia_ObjCioId(pObj);
  uVar4 = Tim_ManBoxForCi(p_00,iVar1);
  if ((int)uVar4 < 0) {
    return;
  }
  iVar2 = Tim_ManBoxOutputFirst(p_00,uVar4);
  iVar3 = Tim_ManBoxOutputNum(p_00,uVar4);
  iVar1 = 0;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  while (bVar9 = iVar1 != 0, iVar1 = iVar1 + -1, bVar9) {
    pGVar6 = Gia_ManCi(p,iVar2);
    Gia_ObjSetTravIdCurrent(p,pGVar6);
    iVar2 = iVar2 + 1;
  }
  iVar2 = Tim_ManBoxInputFirst(p_00,uVar4);
  iVar3 = Tim_ManBoxInputNum(p_00,uVar4);
  iVar1 = 0;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  while (bVar9 = iVar1 != 0, iVar1 = iVar1 + -1, bVar9) {
    pGVar6 = Gia_ManCo(p,iVar2);
    Gia_ManDfsCollect_rec(p,pGVar6,vObjs);
    iVar2 = iVar2 + 1;
  }
  uVar4 = ~uVar4;
LAB_001f9d7e:
  Vec_IntPush(vObjs,uVar4);
  return;
}

Assistant:

void Gia_ManDfsCollect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vObjs )
{
    if ( Gia_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Gia_ObjSetTravIdCurrent( p, pObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
        if ( pManTime )
        {
            int i, iFirst, nTerms, iBox;
            iBox = Tim_ManBoxForCi( pManTime, Gia_ObjCioId(pObj) );
            if ( iBox >= 0 ) // pObj is a box input
            {
                // mark box outputs
                iFirst = Tim_ManBoxOutputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pObj = Gia_ManCi( p, iFirst + i );
                    Gia_ObjSetTravIdCurrent( p, pObj );
                }
                // traverse box inputs
                iFirst = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pObj = Gia_ManCo( p, iFirst + i );
                    Gia_ManDfsCollect_rec( p, pObj, vObjs );
                }
                // save the box
                Vec_IntPush( vObjs, -iBox-1 );
            }
        }
        return;
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        Gia_ManDfsCollect_rec( p, Gia_ObjFanin0(pObj), vObjs );
    }
    else if ( Gia_ObjIsAnd(pObj) )
    { 
        int iFan, k, iObj = Gia_ObjId(p, pObj);
        if ( Gia_ManHasMapping(p) )
        {
            assert( Gia_ObjIsLut(p, iObj) );
            Gia_LutForEachFanin( p, iObj, iFan, k )
                Gia_ManDfsCollect_rec( p, Gia_ManObj(p, iFan), vObjs );
        }
        else
        {
            Gia_ManDfsCollect_rec( p, Gia_ObjFanin0(pObj), vObjs );
            Gia_ManDfsCollect_rec( p, Gia_ObjFanin1(pObj), vObjs );
        }
        // save the object
        Vec_IntPush( vObjs, iObj );
    }
    else if ( !Gia_ObjIsConst0(pObj) )
        assert( 0 );
}